

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilters.cpp
# Opt level: O2

double __thiscall
chrono::utils::ChISO2631_1_UpwardStep::Filter(ChISO2631_1_UpwardStep *this,double u)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  auVar5._8_56_ = in_register_00001208;
  auVar5._0_8_ = u;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = this->m_b2;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = this->m_a2;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = this->m_b0;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = this->m_u_hist1 * this->m_b1;
  auVar1 = vfmadd231sd_fma(auVar7,auVar5._0_16_,auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = this->m_u_hist2;
  auVar1 = vfmadd132sd_fma(auVar6,auVar1,auVar2);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = this->m_y_hist1;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = this->m_a1;
  auVar1 = vfnmadd231sd_fma(auVar1,auVar8,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = this->m_y_hist2;
  auVar1 = vfnmadd231sd_fma(auVar1,auVar9,auVar4);
  this->m_u_hist2 = this->m_u_hist1;
  this->m_u_hist1 = u;
  this->m_y_hist2 = this->m_y_hist1;
  this->m_y_hist1 = auVar1._0_8_;
  return auVar1._0_8_;
}

Assistant:

double ChISO2631_1_UpwardStep::Filter(double u) {
    double y = m_b0 * u + m_b1 * m_u_hist1 + m_b2 * m_u_hist2 - m_a1 * m_y_hist1 - m_a2 * m_y_hist2;

    m_u_hist2 = m_u_hist1;
    m_u_hist1 = u;

    m_y_hist2 = m_y_hist1;
    m_y_hist1 = y;

    return y;
}